

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>
::basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>>
          (basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
           *this,binary_iterator_source<(anonymous_namespace)::MyIterator> *source,
          bson_decode_options *options,allocator<char> *temp_alloc)

{
  allocator *in_RCX;
  ser_context *in_RDI;
  binary_iterator_source<(anonymous_namespace)::MyIterator> *other;
  binary_iterator_source<(anonymous_namespace)::MyIterator> *in_stack_ffffffffffffff80;
  allocator<unsigned_char> *this_00;
  ser_context *__args_2;
  int *__args_1;
  string *this_01;
  string *this_02;
  undefined1 local_21 [33];
  
  local_21._1_8_ = in_RCX;
  ser_context::ser_context(in_RDI);
  in_RDI->_vptr_ser_context = (_func_int **)&PTR__basic_bson_parser_01335b10;
  *(undefined1 *)&in_RDI[1]._vptr_ser_context = 1;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1]._vptr_ser_context + 2) = 0;
  *(undefined4 *)((long)&in_RDI[1]._vptr_ser_context + 4) = 0;
  other = (binary_iterator_source<(anonymous_namespace)::MyIterator> *)(in_RDI + 2);
  binary_iterator_source<(anonymous_namespace)::MyIterator>::binary_iterator_source
            (in_stack_ffffffffffffff80,other);
  this_00 = (allocator<unsigned_char> *)(in_RDI + 9);
  bson_decode_options::bson_decode_options
            ((bson_decode_options *)this_00,(bson_decode_options *)other);
  __args_2 = in_RDI + 0xc;
  __args_1 = (int *)local_21;
  std::allocator<unsigned_char>::allocator<char>(this_00,(allocator<char> *)other);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             (allocator_type *)other);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x284937);
  this_01 = (string *)(in_RDI + 0xf);
  std::__cxx11::string::string(this_01,(allocator *)local_21._1_8_);
  this_02 = (string *)(in_RDI + 0x13);
  std::__cxx11::string::string(this_02,(allocator *)local_21._1_8_);
  std::allocator<jsoncons::bson::parse_state>::allocator<char>
            ((allocator<jsoncons::bson::parse_state> *)this_00,(allocator<char> *)other);
  std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::vector
            ((vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)
             this_00,(allocator_type *)other);
  std::allocator<jsoncons::bson::parse_state>::~allocator
            ((allocator<jsoncons::bson::parse_state> *)0x2849a7);
  std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
  emplace_back<jsoncons::bson::parse_mode,int,int>
            ((vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)
             this_02,(parse_mode *)this_01,__args_1,(int *)__args_2);
  return;
}

Assistant:

basic_bson_parser(Sourceable&& source,
                      const bson_decode_options& options = bson_decode_options(),
                      const TempAllocator& temp_alloc = TempAllocator())
       : source_(std::forward<Sourceable>(source)), 
         options_(options),
         bytes_buffer_(temp_alloc),
         name_buffer_(temp_alloc),
         text_buffer_(temp_alloc),
         state_stack_(temp_alloc)
    {
        state_stack_.emplace_back(parse_mode::root,0,0);
    }